

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__gif_test_raw(stbi__context *s)

{
  stbi_uc sVar1;
  int sz;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  sVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
  ;
  if ((((sVar1 == 'G') &&
       (sVar1 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
       sVar1 == 'I')) &&
      (sVar1 = stbi__get8((stbi__context *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
      sVar1 == 'F')) &&
     (sVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),
     sVar1 == '8')) {
    sVar1 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if ((sVar1 != '9') && (sVar1 != '7')) {
      return 0;
    }
    sVar1 = stbi__get8((stbi__context *)(ulong)CONCAT14(sVar1,in_stack_ffffffffffffffe8));
    if (sVar1 != 'a') {
      return 0;
    }
    return 1;
  }
  return 0;
}

Assistant:

static int stbi__gif_test_raw(stbi__context *s)
{
   int sz;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8') return 0;
   sz = stbi__get8(s);
   if (sz != '9' && sz != '7') return 0;
   if (stbi__get8(s) != 'a') return 0;
   return 1;
}